

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-object.c
# Opt level: O1

void show_inven(wchar_t mode,item_tester tester)

{
  wchar_t wVar1;
  wchar_t wVar2;
  wchar_t wVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  char *pcVar7;
  
  wVar3 = weight_remaining(player);
  wipe_obj_list();
  if ((mode & 1U) != L'\0') {
    wVar1 = player->upkeep->total_weight;
    wVar2 = -wVar3;
    if (L'\0' < wVar3) {
      wVar2 = wVar3;
    }
    pcVar7 = "remaining";
    if (wVar3 < L'\0') {
      pcVar7 = "overweight";
    }
    strnfmt(items[num_obj].label,0x50,"Burden %d.%d lb (%d.%d lb %s) ",(ulong)(uint)(wVar1 / 10),
            (ulong)(uint)(wVar1 % 10),(ulong)(uint)wVar2 / 10,(ulong)((uint)wVar2 % 10),pcVar7);
    lVar4 = (long)num_obj;
    num_obj = num_obj + L'\x01';
    items[lVar4].object = (object *)0x0;
  }
  if ((ulong)z_info->pack_size == 0) {
    wVar3 = L'\xffffffff';
  }
  else {
    uVar6 = 0xffffffff;
    uVar5 = 0;
    do {
      if (player->upkeep->inven[uVar5] != (object *)0x0) {
        uVar6 = uVar5 & 0xffffffff;
      }
      wVar3 = (wchar_t)uVar6;
      uVar5 = uVar5 + 1;
    } while (z_info->pack_size != uVar5);
  }
  build_obj_list(wVar3,player->upkeep->inven,tester,mode);
  num_head = mode & 1U;
  show_obj_list(mode);
  return;
}

Assistant:

void show_inven(int mode, item_tester tester)
{
	int i, last_slot = -1;
	int diff = weight_remaining(player);

	bool in_term = (mode & OLIST_WINDOW) ? true : false;

	/* Initialize */
	wipe_obj_list();

	/* Include burden for term windows */
	if (in_term) {
		strnfmt(items[num_obj].label, sizeof(items[num_obj].label),
		        "Burden %d.%d lb (%d.%d lb %s) ",
		        player->upkeep->total_weight / 10,
				player->upkeep->total_weight % 10,
		        abs(diff) / 10, abs(diff) % 10,
		        (diff < 0 ? "overweight" : "remaining"));

		items[num_obj].object = NULL;
		num_obj++;
	}

	/* Find the last occupied inventory slot */
	for (i = 0; i < z_info->pack_size; i++)
		if (player->upkeep->inven[i] != NULL) last_slot = i;

	/* Build the object list */
	build_obj_list(last_slot, player->upkeep->inven, tester, mode);

	/* Term window starts with a burden header */
	num_head = in_term ? 1 : 0;

	/* Display the object list */
	show_obj_list(mode);
}